

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

int auth_password(AuthPolicy *ap,ptrlen username,ptrlen password,ptrlen *new_password_opt)

{
  _Bool _Var1;
  bool bVar2;
  
  if (new_password_opt == (ptrlen *)0x0) {
    _Var1 = ptrlen_eq_string(password,"weasel");
    if (_Var1) {
      return 1;
    }
    bVar2 = ptrlen_eq_string(password,"ferret");
  }
  else {
    _Var1 = ptrlen_eq_string(password,"ferret");
    if (!_Var1) {
      return 0;
    }
    _Var1 = ptrlen_eq_string(*new_password_opt,"weasel");
    if (_Var1) {
      return 1;
    }
    _Var1 = ptrlen_eq_string(*new_password_opt,"ferret");
    bVar2 = !_Var1;
  }
  return (uint)bVar2 * 2;
}

Assistant:

int auth_password(AuthPolicy *ap, ptrlen username, ptrlen password,
                  ptrlen *new_password_opt)
{
    const char *PHONY_GOOD_PASSWORD = "weasel";
    const char *PHONY_BAD_PASSWORD = "ferret";

    if (!new_password_opt) {
        /* Accept login with our preconfigured good password */
        if (ptrlen_eq_string(password, PHONY_GOOD_PASSWORD))
            return 1;
        /* Don't outright reject the bad password, but insist on a change */
        if (ptrlen_eq_string(password, PHONY_BAD_PASSWORD))
            return 2;
        /* Reject anything else */
        return 0;
    } else {
        /* In a password-change request, expect the bad password as input */
        if (!ptrlen_eq_string(password, PHONY_BAD_PASSWORD))
            return 0;
        /* Accept a request to change it to the good password */
        if (ptrlen_eq_string(*new_password_opt, PHONY_GOOD_PASSWORD))
            return 1;
        /* Outright reject a request to change it to the same password
         * as it already 'was' */
        if (ptrlen_eq_string(*new_password_opt, PHONY_BAD_PASSWORD))
            return 0;
        /* Anything else, pretend the new pw wasn't good enough, and
         * re-request a change */
        return 2;
    }
}